

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall
RegisterGraphTestImplicitOutputOnlyMissing::RegisterGraphTestImplicitOutputOnlyMissing
          (RegisterGraphTestImplicitOutputOnlyMissing *this)

{
  RegisterTest(GraphTestImplicitOutputOnlyMissing::Create,"GraphTest.ImplicitOutputOnlyMissing");
  return;
}

Assistant:

TEST_F(GraphTest, ImplicitOutputOnlyMissing) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build | out.imp: cat in\n"));
  fs_.Create("in", "");

  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out.imp"), &err));
  ASSERT_EQ("", err);

  EXPECT_TRUE(GetNode("out.imp")->dirty());
}